

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_ChangeVelocity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  VMValue *pVVar7;
  AActor *pAVar8;
  char *pcVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar8 = (AActor *)(param->field_0).field_1.a;
      if (pAVar8 != (AActor *)0x0) {
        if ((pAVar8->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar5 = (**(pAVar8->super_DThinker).super_DObject._vptr_DObject)(pAVar8);
          (pAVar8->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
        }
        pPVar6 = (pAVar8->super_DThinker).super_DObject.Class;
        bVar10 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar4 && bVar10) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar10 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d92e6;
        }
      }
      if (numparam == 1) {
        pVVar7 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\x01') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d9305:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c5,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar7 = param;
        if (param[1].field_0.field_3.Type != '\x01') {
          pcVar9 = "(param[paramnum]).Type == REGT_FLOAT";
          goto LAB_003d9305;
        }
      }
      dVar13 = pVVar7[1].field_0.f;
      if (numparam < 3) {
        pVVar7 = defaultparam->Array;
        if (pVVar7[2].field_0.field_3.Type != '\x01') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          goto LAB_003d9324;
        }
      }
      else {
        pVVar7 = param;
        if (param[2].field_0.field_3.Type != '\x01') {
          pcVar9 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d9324:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c6,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      dVar15 = pVVar7[2].field_0.f;
      if (numparam < 4) {
        pVVar7 = defaultparam->Array;
        if (pVVar7[3].field_0.field_3.Type != '\x01') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          goto LAB_003d9343;
        }
      }
      else {
        pVVar7 = param;
        if (param[3].field_0.field_3.Type != '\x01') {
          pcVar9 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d9343:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c7,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      dVar1 = pVVar7[3].field_0.f;
      if (numparam < 5) {
        pVVar7 = defaultparam->Array;
        if (pVVar7[4].field_0.field_3.Type != '\0') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003d9362;
        }
      }
      else {
        pVVar7 = param;
        if (param[4].field_0.field_3.Type != '\0') {
          pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003d9362:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c8,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      uVar2 = pVVar7[4].field_0.i;
      if (numparam < 6) {
        param = defaultparam->Array;
        if (param[5].field_0.field_3.Type == '\0') goto LAB_003d916f;
        pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[5].field_0.field_3.Type == '\0') {
LAB_003d916f:
          pAVar8 = COPY_AAPTR(pAVar8,param[5].field_0.i);
          if (pAVar8 != (AActor *)0x0) {
            dVar11 = (pAVar8->Vel).X;
            bVar3 = false;
            bVar10 = false;
            if ((((dVar11 == 0.0) && (bVar10 = bVar3, !NAN(dVar11))) &&
                (dVar11 = (pAVar8->Vel).Y, dVar11 == 0.0)) && (!NAN(dVar11))) {
              bVar10 = (pAVar8->Vel).Z == 0.0;
            }
            dVar11 = FFastTrig::sin(&fasttrig,
                                    (pAVar8->Angles).Yaw.Degrees * 11930464.711111112 +
                                    6755399441055744.0);
            dVar12 = FFastTrig::cos(&fasttrig,
                                    (pAVar8->Angles).Yaw.Degrees * 11930464.711111112 +
                                    6755399441055744.0);
            if ((uVar2 & 1) != 0) {
              dVar14 = dVar15 * dVar11;
              dVar15 = dVar15 * dVar12 + dVar13 * dVar11;
              dVar13 = dVar13 * dVar12 - dVar14;
            }
            if ((uVar2 & 2) == 0) {
              (pAVar8->Vel).X = dVar13 + (pAVar8->Vel).X;
              (pAVar8->Vel).Y = dVar15 + (pAVar8->Vel).Y;
              (pAVar8->Vel).Z = dVar1 + (pAVar8->Vel).Z;
            }
            else {
              (pAVar8->Vel).Z = dVar1;
              (pAVar8->Vel).Y = dVar15;
              (pAVar8->Vel).X = dVar13;
            }
            if (!bVar10) {
              CheckStopped(pAVar8);
            }
          }
          return 0;
        }
        pcVar9 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x12c9,
                    "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d92e6:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x12c4,
                "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ChangeVelocity)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT_DEF	(x)		
	PARAM_FLOAT_DEF	(y)		
	PARAM_FLOAT_DEF	(z)		
	PARAM_INT_DEF	(flags)	
	PARAM_INT_DEF	(ptr)	

	AActor *ref = COPY_AAPTR(self, ptr);

	if (ref == NULL)
	{
		return 0;
	}

	INTBOOL was_moving = !ref->Vel.isZero();

	DVector3 vel(x, y, z);
	double sina = ref->Angles.Yaw.Sin();
	double cosa = ref->Angles.Yaw.Cos();

	if (flags & 1)	// relative axes - make x, y relative to actor's current angle
	{
		vel.X = x*cosa - y*sina;
		vel.Y = x*sina + y*cosa;
	}
	if (flags & 2)	// discard old velocity - replace old velocity with new velocity
	{
		ref->Vel = vel;
	}
	else	// add new velocity to old velocity
	{
		ref->Vel += vel;
	}

	if (was_moving)
	{
		CheckStopped(ref);
	}
	return 0;
}